

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_stream_socket.hpp
# Opt level: O1

size_t __thiscall
asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>::write_some<asio::const_buffers_1>
          (basic_stream_socket<asio::ip::tcp,_asio::any_io_executor> *this,const_buffers_1 *buffers)

{
  size_t sVar1;
  error_code __ec;
  error_code ec;
  error_code local_48;
  system_error local_38 [32];
  
  local_48._M_value = 0;
  local_48._M_cat = (error_category *)std::_V2::system_category();
  sVar1 = detail::socket_ops::sync_send1
                    ((this->super_basic_socket<asio::ip::tcp,_asio::any_io_executor>).impl_.
                     implementation_.super_base_implementation_type.socket_,
                     (this->super_basic_socket<asio::ip::tcp,_asio::any_io_executor>).impl_.
                     implementation_.super_base_implementation_type.state_,
                     (buffers->super_const_buffer).data_,(buffers->super_const_buffer).size_,0,
                     &local_48);
  __ec._4_4_ = 0;
  __ec._M_value = local_48._M_value;
  if (local_48._M_value != 0) {
    __ec._M_cat = local_48._M_cat;
    std::system_error::system_error(local_38,__ec,"write_some");
    detail::throw_exception<std::system_error>(local_38);
    std::system_error::~system_error(local_38);
  }
  return sVar1;
}

Assistant:

std::size_t write_some(const ConstBufferSequence& buffers)
  {
    asio::error_code ec;
    std::size_t s = this->impl_.get_service().send(
        this->impl_.get_implementation(), buffers, 0, ec);
    asio::detail::throw_error(ec, "write_some");
    return s;
  }